

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O0

void __thiscall xs::PosixTestProcess::~PosixTestProcess(PosixTestProcess *this)

{
  Process *this_00;
  PosixTestProcess *this_local;
  
  (this->super_TestProcess)._vptr_TestProcess = (_func_int **)&PTR__PosixTestProcess_0015f5b0;
  this_00 = this->m_process;
  if (this_00 != (Process *)0x0) {
    de::Process::~Process(this_00);
    operator_delete(this_00,8);
  }
  posix::FileReader::~FileReader(&this->m_logReader);
  posix::PipeReader::~PipeReader(&this->m_stdErrReader);
  posix::PipeReader::~PipeReader(&this->m_stdOutReader);
  posix::CaseListWriter::~CaseListWriter(&this->m_caseListWriter);
  de::BlockBuffer<unsigned_char>::~BlockBuffer(&this->m_infoBuffer);
  std::__cxx11::string::~string((string *)&this->m_logFileName);
  TestProcess::~TestProcess(&this->super_TestProcess);
  return;
}

Assistant:

PosixTestProcess::~PosixTestProcess (void)
{
	delete m_process;
}